

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

int __thiscall LinkedObjectFile::get_label_id_for(LinkedObjectFile *this,int seg,int offset)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  value_type *__x;
  vector<Label,_std::allocator<Label>_> *this_00;
  reference pvVar4;
  pointer ppVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  value_type *label_1;
  Label label;
  int id;
  iterator kv;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string *this_01;
  string local_98 [4];
  int in_stack_ffffffffffffff6c;
  string local_78 [32];
  string local_58 [32];
  int local_38;
  int local_34;
  int local_2c;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_28;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_20;
  int local_18;
  int local_14;
  int local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  std::
  vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::at((vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
        *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::find(in_stack_ffffffffffffff18,(key_type *)0x1a99ae);
  std::
  vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::at((vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
        *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::end(in_stack_ffffffffffffff18);
  bVar2 = std::__detail::operator==(&local_20,&local_28);
  if (bVar2) {
    sVar3 = std::vector<Label,_std::allocator<Label>_>::size
                      ((vector<Label,_std::allocator<Label>_> *)(in_RDI + 0xa8));
    local_2c = (int)sVar3;
    Label::Label((Label *)0x1a9a22);
    local_38 = local_14;
    local_34 = local_18;
    std::__cxx11::to_string(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    this_01 = local_78;
    std::__cxx11::string::operator=(local_58,this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(local_98);
    iVar1 = local_2c;
    std::
    vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
    ::at((vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
          *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
    __x = (value_type *)
          std::
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)in_stack_ffffffffffffff20,(key_type *)in_stack_ffffffffffffff18);
    *(int *)__x = iVar1;
    std::vector<Label,_std::allocator<Label>_>::push_back
              ((vector<Label,_std::allocator<Label>_> *)this_01,__x);
    local_4 = local_2c;
    Label::~Label((Label *)0x1a9b19);
  }
  else {
    this_00 = (vector<Label,_std::allocator<Label>_> *)(in_RDI + 0xa8);
    std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
              ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)0x1a9b75);
    pvVar4 = std::vector<Label,_std::allocator<Label>_>::at
                       (this_00,(size_type)in_stack_ffffffffffffff18);
    if (pvVar4->offset != local_18) {
      __assert_fail("label.offset == offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x34,"int LinkedObjectFile::get_label_id_for(int, int)");
    }
    if (pvVar4->target_segment != local_14) {
      __assert_fail("label.target_segment == seg",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x35,"int LinkedObjectFile::get_label_id_for(int, int)");
    }
    ppVar5 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)0x1a9bf9);
    local_4 = ppVar5->second;
  }
  return local_4;
}

Assistant:

int LinkedObjectFile::get_label_id_for(int seg, int offset) {
  auto kv = label_per_seg_by_offset.at(seg).find(offset);
  if (kv == label_per_seg_by_offset.at(seg).end()) {
    // create a new label
    int id = labels.size();
    Label label;
    label.target_segment = seg;
    label.offset = offset;
    label.name = "L" + std::to_string(id);
    label_per_seg_by_offset.at(seg)[offset] = id;
    labels.push_back(label);
    return id;
  } else {
    // return an existing label
    auto& label = labels.at(kv->second);
    assert(label.offset == offset);
    assert(label.target_segment == seg);
    return kv->second;
  }
}